

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O0

void __thiscall ExternRefSymbol::saveXml(ExternRefSymbol *this,ostream *s)

{
  ostream *s_00;
  allocator local_39;
  string local_38 [32];
  ostream *local_18;
  ostream *s_local;
  ExternRefSymbol *this_local;
  
  local_18 = s;
  s_local = (ostream *)this;
  std::operator<<(s,"<externrefsymbol");
  s_00 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"name",&local_39);
  a_v(s_00,(string *)local_38,&(this->super_Symbol).name);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::operator<<(local_18,">\n");
  Address::saveXml(&this->refaddr,local_18);
  std::operator<<(local_18,"</externrefsymbol>\n");
  return;
}

Assistant:

void ExternRefSymbol::saveXml(ostream &s) const

{
  s << "<externrefsymbol";
  a_v(s,"name",name);
  s << ">\n";
  refaddr.saveXml(s);
  s << "</externrefsymbol>\n";
}